

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O0

void __thiscall
Js::DebugContext::RegisterFunction
          (DebugContext *this,ParseableFunctionInfo *func,DWORD_PTR dwDebugSourceContext,
          LPCWSTR title)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *this_00;
  undefined4 *puVar4;
  void *unaff_retaddr;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  AutoNestedHandledExceptionType local_38;
  int local_34;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  FunctionBody *functionBody;
  LPCWSTR title_local;
  DWORD_PTR dwDebugSourceContext_local;
  ParseableFunctionInfo *func_local;
  DebugContext *this_local;
  
  bVar2 = CanRegisterFunction(this);
  if (bVar2) {
    ___autoNestedHandledExceptionType = (FunctionBody *)0x0;
    BVar3 = FunctionProxy::IsDeferredParseFunction(&func->super_FunctionProxy);
    if (BVar3 == 0) {
      ___autoNestedHandledExceptionType = FunctionProxy::GetFunctionBody(&func->super_FunctionProxy)
      ;
    }
    else {
      local_34 = 0;
      this_00 = ScriptContext::GetThreadContext(this->scriptContext);
      bVar2 = ThreadContext::IsScriptActive(this_00);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                    ,0x6f,
                                    "(!this->scriptContext->GetThreadContext()->IsScriptActive())",
                                    "!this->scriptContext->GetThreadContext()->IsScriptActive()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (&local_38,
                 ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                 ExceptionType_OutOfMemory);
      scriptContext = this->scriptContext;
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)&err,scriptContext,
                 (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                 &stack0x00000000,false,false,false);
      ScriptContext::OnScriptStart(scriptContext,false,true);
      EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&err);
      ___autoNestedHandledExceptionType =
           ParseableFunctionInfo::Parse(func,(ScriptFunction **)0x0,false);
      EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&err);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_38);
      if (local_34 < 0) {
        return;
      }
    }
    RegisterFunction(this,___autoNestedHandledExceptionType,dwDebugSourceContext,title);
  }
  return;
}

Assistant:

void DebugContext::RegisterFunction(Js::ParseableFunctionInfo * func, DWORD_PTR dwDebugSourceContext, LPCWSTR title)
    {
        if (!this->CanRegisterFunction())
        {
            return;
        }

        FunctionBody * functionBody = nullptr;
        if (func->IsDeferredParseFunction())
        {
            HRESULT hr = S_OK;
            Assert(!this->scriptContext->GetThreadContext()->IsScriptActive());

            BEGIN_JS_RUNTIME_CALL_EX_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED(this->scriptContext, false)
            {
                functionBody = func->Parse();
            }
            END_JS_RUNTIME_CALL_AND_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT(hr);

            if (FAILED(hr))
            {
                return;
            }
        }
        else
        {
            functionBody = func->GetFunctionBody();
        }
        this->RegisterFunction(functionBody, dwDebugSourceContext, title);
    }